

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::SwizzleToRGBATestR8_RRRONE_Test> *this)

{
  Test *this_00;
  GTestFlagSaver *pGVar1;
  initializer_list<unsigned_char> __l;
  allocator_type local_59;
  size_type __dnew;
  pointer puStack_50;
  pointer local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> defaultColor;
  uchar local_1c [4];
  
  this_00 = (Test *)operator_new(0x158);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__SwizzleTestBase_00194250;
  this_00[8].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&this_00[9].gtest_flag_saver_;
  __dnew = 0x1f;
  pGVar1 = (GTestFlagSaver *)
           std::__cxx11::string::_M_create((ulong *)&this_00[8].gtest_flag_saver_,(ulong)&__dnew);
  this_00[8].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = pGVar1;
  this_00[9].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)__dnew;
  builtin_strncpy((char *)((long)&(pGVar1->color_)._M_dataplus + 7)," 1.0 __d",8);
  builtin_strncpy((char *)((long)&(pGVar1->color_)._M_string_length + 7),"efault__",8);
  pGVar1->also_run_disabled_tests_ = true;
  pGVar1->break_on_failure_ = true;
  pGVar1->catch_exceptions_ = true;
  pGVar1->field_0x3 = 't';
  pGVar1->field_0x4 = 'e';
  pGVar1->field_0x5 = 'T';
  pGVar1->field_0x6 = 'e';
  pGVar1->field_0x7 = 's';
  (pGVar1->color_)._M_dataplus._M_p = (pointer)0x207265706c654874;
  this_00[9]._vptr_Test = (_func_int **)__dnew;
  (&(this_00[8].gtest_flag_saver_._M_t.
     super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
     ._M_t.
     super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
     .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl)->
    also_run_disabled_tests_)[__dnew] = false;
  this_00[10].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&this_00[0xb].gtest_flag_saver_;
  this_00[0xb]._vptr_Test = (_func_int **)0x0;
  *(undefined1 *)
   &this_00[0xb].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0;
  this_00[0xd]._vptr_Test = (_func_int **)0x0;
  this_00[0xd].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[0xe]._vptr_Test = (_func_int **)0x0;
  this_00[0xe].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00[0xf]._vptr_Test = (_func_int **)0x0;
  this_00[0xf].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined4 *)&this_00[0x10]._vptr_Test = 0x8229;
  this_00[0x13]._vptr_Test = (_func_int **)0x140100000001;
  this_00[0x13].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x190300001903;
  this_00[0x15]._vptr_Test = (_func_int **)0x1000000010;
  local_48 = (pointer)0x0;
  __dnew = 0;
  puStack_50 = (pointer)0x0;
  builtin_memcpy(local_1c,"\x01\x02\x03\x04",4);
  __l._M_len = 4;
  __l._M_array = local_1c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&defaultColor,__l,&local_59);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__dnew,1);
  *(uchar *)__dnew =
       *defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  WriterTestHelper<unsigned_char,_1U,_33321U>::resize
            ((WriterTestHelper<unsigned_char,_1U,_33321U> *)(this_00 + 1),0,1,1,2,
             *(ktx_uint32_t *)&this_00[0x15]._vptr_Test,
             *(ktx_uint32_t *)((long)&this_00[0x15]._vptr_Test + 4),1,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__dnew);
  if (defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(defaultColor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)defaultColor.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)defaultColor.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (__dnew != 0) {
    operator_delete((void *)__dnew,(long)local_48 - __dnew);
  }
  this_00->_vptr_Test = (_func_int **)&PTR__SwizzleTestBase_001941c8;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }